

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_critbit.c
# Opt level: O2

void test_insert_reverse(CuTest *tc)

{
  int iVar1;
  char *pcVar2;
  critbit_tree cb;
  
  cb.root = (void *)0x0;
  iVar1 = cb_insert(&cb,"herp",5);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x42,(char *)0x0,0,iVar1);
  iVar1 = cb_insert(&cb,"hurp",5);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x44,(char *)0x0,0,iVar1);
  iVar1 = cb_insert(&cb,"derp",5);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x46,(char *)0x0,0,iVar1);
  pcVar2 = (char *)cb_find(&cb,"herp",5);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x49,(char *)0x0,"herp",pcVar2);
  pcVar2 = (char *)cb_find(&cb,"derp",5);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x4b,(char *)0x0,"derp",pcVar2);
  pcVar2 = (char *)cb_find(&cb,"hurp",5);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x4d,(char *)0x0,"hurp",pcVar2);
  cb_clear(&cb);
  return;
}

Assistant:

static void test_insert_reverse(CuTest * tc)
{
  critbit_tree cb = CRITBIT_TREE();
  int result;
  const char * str;

  result = cb_insert_str(&cb, "herp");
  CuAssertIntEquals(tc, CB_SUCCESS, result);
  result = cb_insert_str(&cb, "hurp");
  CuAssertIntEquals(tc, CB_SUCCESS, result);
  result = cb_insert_str(&cb, "derp");
  CuAssertIntEquals(tc, CB_SUCCESS, result);

  str = cb_find_str(&cb, "herp");
  CuAssertStrEquals(tc, "herp", str);
  str = cb_find_str(&cb, "derp");
  CuAssertStrEquals(tc, "derp", str);
  str = cb_find_str(&cb, "hurp");
  CuAssertStrEquals(tc, "hurp", str);

  cb_clear(&cb);
}